

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O2

void * rw::d3d9::createVertexDeclaration(VertexElement *elements)

{
  short *psVar1;
  void *pvVar2;
  ulong uVar3;
  
  uVar3 = 0;
  do {
    psVar1 = (short *)((long)&elements->stream + uVar3);
    uVar3 = uVar3 + 8;
  } while (*psVar1 != 0xff);
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d9.cpp line: 84"
  ;
  pvVar2 = (void *)(*DAT_00143848)(uVar3 & 0x7fffffff8,0x30b00);
  pvVar2 = memcpy(pvVar2,elements,uVar3 & 0x7fffffff8);
  return pvVar2;
}

Assistant:

void*
createVertexDeclaration(VertexElement *elements)
{
#ifdef RW_D3D9
	IDirect3DVertexDeclaration9 *decl = 0;
	d3ddevice->CreateVertexDeclaration((D3DVERTEXELEMENT9*)elements, &decl);
	if(decl)
		d3d9Globals.numVertexDeclarations++;
	return decl;
#else
	int n = 0;
	VertexElement *e = (VertexElement*)elements;
	while(e[n++].stream != 0xFF)
		;
	e = rwNewT(VertexElement, n, MEMDUR_EVENT | ID_DRIVER);
	memcpy(e, elements, n*sizeof(VertexElement));
	return e;
#endif
}